

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::StatementSyntax::isKind(SyntaxKind kind)

{
  if ((((0x3e < kind - DisableForkStatement) ||
       ((0x6402040020000205U >> ((ulong)(kind - DisableForkStatement) & 0x3f) & 1) == 0)) &&
      ((0x3c < kind - NonblockingEventTriggerStatement ||
       ((0x1400f00000080001U >> ((ulong)(kind - NonblockingEventTriggerStatement) & 0x3f) & 1) == 0)
       ))) && ((((0x3f < kind - AssertPropertyStatement ||
                 ((0x8000010204000041U >> ((ulong)(kind - AssertPropertyStatement) & 0x3f) & 1) == 0
                 )) && ((0x2f < kind - ImmediateAssertStatement ||
                        ((0x80001000000dU >> ((ulong)(kind - ImmediateAssertStatement) & 0x3f) & 1)
                         == 0)))) &&
               ((((0x32 < kind - TimingControlStatement ||
                  ((0x7400000000001U >> ((ulong)(kind - TimingControlStatement) & 0x3f) & 1) == 0))
                 && ((0x12 < kind - RestrictPropertyStatement ||
                     ((0x40003U >> (kind - RestrictPropertyStatement & 0x1f) & 1) == 0)))) &&
                (1 < kind - CoverPropertyStatement)))))) {
    return false;
  }
  return true;
}

Assistant:

bool StatementSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AssertPropertyStatement:
        case SyntaxKind::AssumePropertyStatement:
        case SyntaxKind::BlockingEventTriggerStatement:
        case SyntaxKind::CaseStatement:
        case SyntaxKind::CheckerInstanceStatement:
        case SyntaxKind::ConditionalStatement:
        case SyntaxKind::CoverPropertyStatement:
        case SyntaxKind::CoverSequenceStatement:
        case SyntaxKind::DisableForkStatement:
        case SyntaxKind::DisableStatement:
        case SyntaxKind::DoWhileStatement:
        case SyntaxKind::EmptyStatement:
        case SyntaxKind::ExpectPropertyStatement:
        case SyntaxKind::ExpressionStatement:
        case SyntaxKind::ForLoopStatement:
        case SyntaxKind::ForeachLoopStatement:
        case SyntaxKind::ForeverStatement:
        case SyntaxKind::ImmediateAssertStatement:
        case SyntaxKind::ImmediateAssumeStatement:
        case SyntaxKind::ImmediateCoverStatement:
        case SyntaxKind::JumpStatement:
        case SyntaxKind::LoopStatement:
        case SyntaxKind::NonblockingEventTriggerStatement:
        case SyntaxKind::ParallelBlockStatement:
        case SyntaxKind::ProceduralAssignStatement:
        case SyntaxKind::ProceduralDeassignStatement:
        case SyntaxKind::ProceduralForceStatement:
        case SyntaxKind::ProceduralReleaseStatement:
        case SyntaxKind::RandCaseStatement:
        case SyntaxKind::RandSequenceStatement:
        case SyntaxKind::RestrictPropertyStatement:
        case SyntaxKind::ReturnStatement:
        case SyntaxKind::SequentialBlockStatement:
        case SyntaxKind::TimingControlStatement:
        case SyntaxKind::VoidCastedCallStatement:
        case SyntaxKind::WaitForkStatement:
        case SyntaxKind::WaitOrderStatement:
        case SyntaxKind::WaitStatement:
            return true;
        default:
            return false;
    }
}